

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  bool bVar1;
  _Bool _Var2;
  ImGuiWindowTempData *lhs;
  bool local_62;
  bool local_61;
  bool pressed;
  bool held;
  ImVec2 IStack_60;
  bool hovered;
  undefined1 local_58 [8];
  ImRect bb;
  ImVec2 local_3c;
  ImVec2 size;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiButtonFlags flags_local;
  ImVec2 *size_arg_local;
  char *str_id_local;
  
  register0x00000000 = GetCurrentWindow();
  if ((register0x00000000->SkipItems & 1U) == 0) {
    bVar1 = false;
    if ((size_arg->x != 0.0) || (NAN(size_arg->x))) {
      bVar1 = size_arg->y != 0.0;
    }
    if (!bVar1) {
      __assert_fail("size_arg.x != 0.0f && size_arg.y != 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x2e3,
                    "bool ImGui::InvisibleButton(const char *, const ImVec2 &, ImGuiButtonFlags)");
    }
    size.x = (float)ImGuiWindow::GetID(register0x00000000,str_id,(char *)0x0);
    bb.Max = *size_arg;
    local_3c = CalcItemSize(bb.Max,0.0,0.0);
    lhs = &stack0xffffffffffffffd0->DC;
    IStack_60 = operator+(&lhs->CursorPos,&local_3c);
    ImRect::ImRect((ImRect *)local_58,&lhs->CursorPos,&stack0xffffffffffffffa0);
    ItemSize(&local_3c,-1.0);
    _Var2 = ItemAdd((ImRect *)local_58,(ImGuiID)size.x,(ImRect *)0x0,0);
    if (_Var2) {
      str_id_local._7_1_ =
           ButtonBehavior((ImRect *)local_58,(ImGuiID)size.x,&local_61,&local_62,flags);
    }
    else {
      str_id_local._7_1_ = false;
    }
  }
  else {
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

bool ImGui::InvisibleButton(const char* str_id, const ImVec2& size_arg, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    // Cannot use zero-size for InvisibleButton(). Unlike Button() there is not way to fallback using the label size.
    IM_ASSERT(size_arg.x != 0.0f && size_arg.y != 0.0f);

    const ImGuiID id = window->GetID(str_id);
    ImVec2 size = CalcItemSize(size_arg, 0.0f, 0.0f);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(size);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    return pressed;
}